

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int client_switch_proxy(archive_read_filter *self,uint iindex)

{
  undefined8 uVar1;
  int in_ESI;
  long in_RDI;
  void *data2;
  int r2;
  int r1;
  undefined4 local_2c;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_4;
  
  local_18 = 0;
  local_1c = 0;
  if (*(int *)(*(long *)(in_RDI + 0x18) + 0xf4) == in_ESI) {
    local_4 = 0;
  }
  else {
    *(int *)(*(long *)(in_RDI + 0x18) + 0xf4) = in_ESI;
    uVar1 = *(undefined8 *)
             (*(long *)(*(long *)(in_RDI + 0x18) + 0x100) +
              (ulong)*(uint *)(*(long *)(in_RDI + 0x18) + 0xf4) * 0x18 + 0x10);
    if (*(long *)(*(long *)(in_RDI + 0x18) + 0xe8) == 0) {
      if (*(long *)(*(long *)(in_RDI + 0x18) + 0xe0) != 0) {
        local_18 = (**(code **)(*(long *)(in_RDI + 0x18) + 0xe0))
                             (*(undefined8 *)(in_RDI + 0x18),*(undefined8 *)(in_RDI + 0x50));
      }
      *(undefined8 *)(in_RDI + 0x50) = uVar1;
      if (*(long *)(*(long *)(in_RDI + 0x18) + 0xc0) != 0) {
        local_1c = (**(code **)(*(long *)(in_RDI + 0x18) + 0xc0))
                             (*(undefined8 *)(in_RDI + 0x18),*(undefined8 *)(in_RDI + 0x50));
      }
    }
    else {
      local_1c = (**(code **)(*(long *)(in_RDI + 0x18) + 0xe8))
                           (*(undefined8 *)(in_RDI + 0x18),*(undefined8 *)(in_RDI + 0x50),uVar1);
      *(undefined8 *)(in_RDI + 0x50) = uVar1;
      local_18 = local_1c;
    }
    if (local_18 < local_1c) {
      local_2c = local_18;
    }
    else {
      local_2c = local_1c;
    }
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

static int
client_switch_proxy(struct archive_read_filter *self, unsigned int iindex)
{
  int r1 = ARCHIVE_OK, r2 = ARCHIVE_OK;
	void *data2 = NULL;

	/* Don't do anything if already in the specified data node */
	if (self->archive->client.cursor == iindex)
		return (ARCHIVE_OK);

	self->archive->client.cursor = iindex;
	data2 = self->archive->client.dataset[self->archive->client.cursor].data;
	if (self->archive->client.switcher != NULL)
	{
		r1 = r2 = (self->archive->client.switcher)
			((struct archive *)self->archive, self->data, data2);
		self->data = data2;
	}
	else
	{
		/* Attempt to call close and open instead */
		if (self->archive->client.closer != NULL)
			r1 = (self->archive->client.closer)
				((struct archive *)self->archive, self->data);
		self->data = data2;
		if (self->archive->client.opener != NULL)
			r2 = (self->archive->client.opener)
				((struct archive *)self->archive, self->data);
	}
	return (r1 < r2) ? r1 : r2;
}